

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O0

void extend_plane(uint8_t *src,int src_stride,int width,int height,int extend_top,int extend_left,
                 int extend_bottom,int extend_right,int v_start,int v_end)

{
  int iVar1;
  void *pvVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  uint8_t *dst_ptr2;
  uint8_t *dst_ptr1;
  uint8_t *src_ptr2;
  uint8_t *src_ptr1;
  int in_stack_00000020;
  int linesize;
  int i;
  void *local_48;
  void *local_40;
  byte *local_38;
  byte *local_30;
  int local_20;
  
  iVar1 = in_R9D + (int)src_ptr2 + in_EDX;
  local_30 = (byte *)(in_RDI + (int)src_ptr1 * in_ESI);
  local_48 = (void *)(in_RDI + (int)src_ptr1 * in_ESI + (long)in_EDX);
  local_38 = (byte *)((long)local_48 + -1);
  local_40 = (void *)((in_RDI + (int)src_ptr1 * in_ESI) - (long)in_R9D);
  for (local_20 = (int)src_ptr1; local_20 < in_stack_00000020; local_20 = local_20 + 1) {
    memset(local_40,(uint)*local_30,(long)in_R9D);
    memset(local_48,(uint)*local_38,(long)(int)src_ptr2);
    local_30 = local_30 + in_ESI;
    local_38 = local_38 + in_ESI;
    local_40 = (void *)((long)local_40 + (long)in_ESI);
    local_48 = (void *)((long)local_48 + (long)in_ESI);
  }
  pvVar2 = (void *)(in_RDI - in_R9D);
  local_40 = (void *)((long)pvVar2 + (long)(in_ESI * -in_R8D));
  for (local_20 = 0; local_20 < in_R8D; local_20 = local_20 + 1) {
    memcpy(local_40,pvVar2,(long)iVar1);
    local_40 = (void *)((long)local_40 + (long)in_ESI);
  }
  pvVar2 = (void *)((long)pvVar2 + (long)(in_ESI * (in_ECX + -1)));
  local_48 = pvVar2;
  for (local_20 = 0; local_20 < (int)dst_ptr1; local_20 = local_20 + 1) {
    local_48 = (void *)((long)local_48 + (long)in_ESI);
    memcpy(local_48,pvVar2,(long)iVar1);
  }
  return;
}

Assistant:

static void extend_plane(uint8_t *const src, int src_stride, int width,
                         int height, int extend_top, int extend_left,
                         int extend_bottom, int extend_right, int v_start,
                         int v_end) {
  assert(src != NULL);
  int i;
  const int linesize = extend_left + extend_right + width;
  assert(linesize <= src_stride);

  /* copy the left and right most columns out */
  uint8_t *src_ptr1 = src + v_start * src_stride;
  uint8_t *src_ptr2 = src + v_start * src_stride + width - 1;
  uint8_t *dst_ptr1 = src + v_start * src_stride - extend_left;
  uint8_t *dst_ptr2 = src_ptr2 + 1;

  for (i = v_start; i < v_end; ++i) {
    memset(dst_ptr1, src_ptr1[0], extend_left);
    memset(dst_ptr2, src_ptr2[0], extend_right);
    src_ptr1 += src_stride;
    src_ptr2 += src_stride;
    dst_ptr1 += src_stride;
    dst_ptr2 += src_stride;
  }

  /* Now copy the top and bottom lines into each line of the respective
   * borders
   */
  src_ptr1 = src - extend_left;
  dst_ptr1 = src_ptr1 + src_stride * -extend_top;

  for (i = 0; i < extend_top; ++i) {
    memcpy(dst_ptr1, src_ptr1, linesize);
    dst_ptr1 += src_stride;
  }

  src_ptr2 = src_ptr1 + src_stride * (height - 1);
  dst_ptr2 = src_ptr2;

  for (i = 0; i < extend_bottom; ++i) {
    dst_ptr2 += src_stride;
    memcpy(dst_ptr2, src_ptr2, linesize);
  }
}